

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_released(AMQP_VALUE value,RELEASED_HANDLE *released_handle)

{
  int iVar1;
  AMQP_VALUE pAVar2;
  uint32_t local_34;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  RELEASED_INSTANCE *released_instance;
  RELEASED_HANDLE *ppRStack_18;
  int result;
  RELEASED_HANDLE *released_handle_local;
  AMQP_VALUE value_local;
  
  ppRStack_18 = released_handle;
  released_handle_local = (RELEASED_HANDLE *)value;
  list_value = (AMQP_VALUE)released_create_internal();
  *ppRStack_18 = (RELEASED_HANDLE)list_value;
  if (*ppRStack_18 == (RELEASED_HANDLE)0x0) {
    released_instance._4_4_ = 0x465c;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)released_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      released_destroy(*ppRStack_18);
      released_instance._4_4_ = 0x4664;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,&local_34);
      if (iVar1 == 0) {
        pAVar2 = amqpvalue_clone((AMQP_VALUE)released_handle_local);
        *(AMQP_VALUE *)list_value = pAVar2;
        released_instance._4_4_ = 0;
      }
      else {
        released_instance._4_4_ = 0x466b;
      }
    }
  }
  return released_instance._4_4_;
}

Assistant:

int amqpvalue_get_released(AMQP_VALUE value, RELEASED_HANDLE* released_handle)
{
    int result;
    RELEASED_INSTANCE* released_instance = (RELEASED_INSTANCE*)released_create_internal();
    *released_handle = released_instance;
    if (*released_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            released_destroy(*released_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {

                    released_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}